

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

bool __thiscall SceneRender::loadScene(SceneRender *this,Uniforms *_uniforms)

{
  _Rb_tree_header *p_Var1;
  Model *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  _Base_ptr p_Var5;
  mapped_type *ppLVar6;
  DefaultShaders extraout_EDX;
  DefaultShaders extraout_EDX_00;
  DefaultShaders extraout_EDX_01;
  DefaultShaders DVar7;
  DefaultShaders _type;
  DefaultShaders extraout_EDX_02;
  DefaultShaders extraout_EDX_03;
  DefaultShaders extraout_EDX_04;
  DefaultShaders _type_00;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  string local_70;
  string local_50;
  float local_30;
  float local_2c;
  
  vera::cleanLabels();
  p_Var5 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    local_7c = 3.4028235e+38;
    local_30 = 3.4028235e+38;
    local_2c = 3.4028235e+38;
    local_74 = 1.1754944e-38;
    local_78 = 1.1754944e-38;
    local_80 = 1.1754944e-38;
  }
  else {
    local_74 = 1.1754944e-38;
    local_80 = 1.1754944e-38;
    local_78 = 1.1754944e-38;
    local_7c = 3.4028235e+38;
    local_2c = 3.4028235e+38;
    local_30 = 3.4028235e+38;
    do {
      vera::addLabel(&(*(Model **)(p_Var5 + 2))->m_name,*(Model **)(p_Var5 + 2),LABEL_RIGHT,0.0);
      lVar4 = *(long *)(p_Var5 + 2);
      fVar8 = *(float *)(lVar4 + 0x298);
      fVar9 = *(float *)(lVar4 + 0x29c);
      fVar10 = *(float *)(lVar4 + 0x2a0);
      fVar11 = fVar8;
      if (local_30 <= fVar8) {
        fVar11 = local_30;
      }
      if (fVar8 <= local_78) {
        fVar8 = local_78;
      }
      fVar12 = fVar9;
      if (local_7c <= fVar9) {
        fVar12 = local_7c;
      }
      if (fVar9 <= local_74) {
        fVar9 = local_74;
      }
      fVar13 = fVar10;
      if (local_2c <= fVar10) {
        fVar13 = local_2c;
      }
      if (fVar10 <= local_80) {
        fVar10 = local_80;
      }
      local_78 = *(float *)(lVar4 + 0x2a4);
      local_74 = *(float *)(lVar4 + 0x2a8);
      local_80 = *(float *)(lVar4 + 0x2ac);
      local_30 = local_78;
      if (fVar11 <= local_78) {
        local_30 = fVar11;
      }
      if (local_78 <= fVar8) {
        local_78 = fVar8;
      }
      local_7c = local_74;
      if (fVar12 <= local_74) {
        local_7c = fVar12;
      }
      if (local_74 <= fVar9) {
        local_74 = fVar9;
      }
      local_2c = local_80;
      if (fVar13 <= local_80) {
        local_2c = fVar13;
      }
      if (local_80 <= fVar10) {
        local_80 = fVar10;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  fVar8 = local_2c * local_2c + local_7c * local_7c + local_30 * local_30;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  fVar9 = local_80 * local_80 + local_74 * local_74 + local_78 * local_78;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  if (fVar9 <= fVar8) {
    fVar9 = fVar8;
  }
  if (fVar9 <= 0.5) {
    fVar9 = 0.5;
  }
  this->m_area = fVar9;
  this->m_floor_height = local_7c;
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"FLOOR","");
  paVar3 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &this->m_floor;
  vera::Model::addDefine(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MODEL_VERTEX_COLOR","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v_color","");
  vera::Model::addDefine(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MODEL_VERTEX_NORMAL","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v_normal","");
  vera::Model::addDefine(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MODEL_VERTEX_TEXCOORD","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v_texcoord","");
  vera::Model::addDefine(this_00,&local_50,&local_70);
  DVar7 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_01;
  }
  vera::getDefaultSrc_abi_cxx11_(&local_50,(vera *)0x9,DVar7);
  vera::getDefaultSrc_abi_cxx11_(&local_70,(vera *)0x8,_type);
  vera::Shader::setSource(&this->m_cubemap_shader,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_light","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"default","");
  ppLVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
            ::operator[](&(_uniforms->super_Scene).lights,&local_70);
  vera::addLabel(&local_50,&(*ppLVar6)->super_Node,LABEL_DOWN,30.0);
  DVar7 = extraout_EDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    DVar7 = extraout_EDX_04;
  }
  vera::getDefaultSrc_abi_cxx11_(&local_50,(vera *)0xd,DVar7);
  vera::getDefaultSrc_abi_cxx11_(&local_70,(vera *)0xc,_type_00);
  vera::Shader::setSource(&this->m_lightUI_shader,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool SceneRender::loadScene(Uniforms& _uniforms) {
    vera::cleanLabels();

    // Calculate the total area
    vera::BoundingBox bbox;
    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        vera::addLabel( it->second->getName(), it->second, vera::LABEL_RIGHT);
        bbox.expand( it->second->getBoundingBox() );
    }

    m_area = glm::max(0.5f, glm::max(glm::length(bbox.min), glm::length(bbox.max)));
    
    // Floor
    m_floor_height = bbox.min.y;
    m_floor.addDefine("FLOOR");
    m_floor.addDefine("MODEL_VERTEX_COLOR", "v_color");
    m_floor.addDefine("MODEL_VERTEX_NORMAL", "v_normal");
    m_floor.addDefine("MODEL_VERTEX_TEXCOORD","v_texcoord");
    // m_floor.setShader(vera::getDefaultSrc(vera::FRAG_DEFAULT_SCENE), vera::getDefaultSrc(vera::VERT_DEFAULT_SCENE));

    // Cubemap
    m_cubemap_shader.setSource(vera::getDefaultSrc(vera::FRAG_CUBEMAP), vera::getDefaultSrc(vera::VERT_CUBEMAP));

    // Light
    vera::addLabel("u_light", _uniforms.lights["default"], vera::LABEL_DOWN, 30.0f);
    m_lightUI_shader.setSource(vera::getDefaultSrc(vera::FRAG_LIGHT), vera::getDefaultSrc(vera::VERT_LIGHT));

    return true;
}